

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::NegativeGLSLLinkTime::Run(NegativeGLSLLinkTime *this)

{
  bool bVar1;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  NegativeGLSLLinkTime *local_18;
  NegativeGLSLLinkTime *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "#version 430 core\nbuffer Buffer { int x; };\nvoid Run();\nvoid main() {\n  Run();\n  x += 2;\n}"
             ,&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "#version 430 core\nbuffer Buffer { uint x; };\nvoid Run() {\n  x += 3;\n}",&local_71);
  bVar1 = Link(this,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,
               "#version 430 core\nbuffer Buffer { int x; int y; };\nvoid Run();\nvoid main() {\n  Run();\n  x += 2;\n}"
               ,&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "#version 430 core\nbuffer Buffer { int x; };\nvoid Run() {\n  x += 3;\n}",&local_c1)
    ;
    bVar1 = Link(this,&local_98,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,
                 "#version 430 core\nbuffer Buffer { int y; };\nvoid Run();\nvoid main() {\n  Run();\n  y += 2;\n}"
                 ,&local_e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,
                 "#version 430 core\nbuffer Buffer { int x; };\nvoid Run() {\n  x += 3;\n}",
                 &local_111);
      bVar1 = Link(this,&local_e8,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,
                   "#version 430 core\nbuffer Buffer { int x; } g_buffer[2];\nvoid Run();\nvoid main() {\n  Run();\n  g_buffer[0].x += 2;\n}"
                   ,&local_139);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,
                   "#version 430 core\nbuffer Buffer { int x; } g_buffer[3];\nvoid Run() {\n  g_buffer[1].x += 3;\n}"
                   ,&local_161);
        bVar1 = Link(this,&local_138,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          this_local = (NegativeGLSLLinkTime *)0x0;
        }
        else {
          this_local = (NegativeGLSLLinkTime *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (NegativeGLSLLinkTime *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (NegativeGLSLLinkTime *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (NegativeGLSLLinkTime *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		//   declaration of "x" conflicts with previous declaration at 0(4)
		//   declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int x; };" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  x += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { uint x; };" NL "void Run() {" NL "  x += 3;" NL "}"))
			return ERROR;

		//  declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int x; int y; };" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  x += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { int x; };" NL "void Run() {" NL "  x += 3;" NL "}"))
			return ERROR;

		//  declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int y; };" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  y += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { int x; };" NL "void Run() {" NL "  x += 3;" NL "}"))
			return ERROR;

		//  declaration of "g_buffer" conflicts with previous declaration at 0(4)
		//  declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int x; } g_buffer[2];" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  g_buffer[0].x += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { int x; } g_buffer[3];" NL "void Run() {" NL
				  "  g_buffer[1].x += 3;" NL "}"))
			return ERROR;

		return NO_ERROR;
	}